

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O3

ProjectionArrayBuffer * Js::ProjectionArrayBuffer::Create(uint32 length,DynamicType *type)

{
  ScriptContext *pSVar1;
  Recycler *pRVar2;
  ProjectionArrayBuffer *this;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  pSVar1 = Js::Type::GetScriptContext(&type->super_Type);
  pRVar2 = pSVar1->recycler;
  Memory::Recycler::AddExternalMemoryUsage(pRVar2,(ulong)length);
  local_48 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_5dae254;
  data.filename._0_4_ = 0x4a1;
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_48);
  this = (ProjectionArrayBuffer *)new<Memory::Recycler>(0x48,pRVar2,0x39e810);
  ProjectionArrayBuffer(this,length,type);
  return this;
}

Assistant:

ProjectionArrayBuffer* ProjectionArrayBuffer::Create(uint32 length, DynamicType * type)
    {
        Recycler* recycler = type->GetScriptContext()->GetRecycler();
        recycler->AddExternalMemoryUsage(length);
        return RecyclerNewFinalized(recycler, ProjectionArrayBuffer, length, type);
    }